

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::BasicTexSubImage2DCase::createTexture(BasicTexSubImage2DCase *this)

{
  ContextWrapper *this_00;
  deUint32 dVar1;
  BasicTexSubImage2DCase *pBVar2;
  uint uVar3;
  deUint32 dVar4;
  int width;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int local_f8;
  deUint32 tex;
  BasicTexSubImage2DCase *local_f0;
  int local_e4;
  int local_e0;
  int local_dc;
  ContextWrapper *local_d8;
  ulong local_d0;
  TextureFormat fmt;
  Vec4 gMax;
  Vec4 gMin;
  Random rnd;
  PixelBufferAccess local_90;
  TextureLevel data;
  Vector<float,_4> local_40;
  
  fmt = (this->super_TextureSpecCase).m_texFormat;
  if (((this->super_TextureSpecCase).m_flags & 1) == 0) {
    local_f8 = 1;
  }
  else {
    uVar5 = (this->super_TextureSpecCase).m_width;
    uVar3 = 0x20;
    uVar6 = uVar3;
    if (uVar5 != 0) {
      uVar6 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      uVar6 = uVar6 ^ 0x1f;
    }
    uVar5 = (this->super_TextureSpecCase).m_height;
    if (uVar5 != 0) {
      uVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = uVar3 ^ 0x1f;
    }
    local_f8 = 0x1f - uVar3;
    if ((int)(0x1f - uVar3) < (int)(0x1f - uVar6)) {
      local_f8 = 0x1f - uVar6;
    }
    local_f8 = local_f8 + 1;
  }
  tex = 0;
  tcu::TextureLevel::TextureLevel(&data,&fmt);
  dVar4 = deStringHash((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                       m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar4);
  this_00 = &(this->super_TextureSpecCase).super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  iVar7 = 0;
  local_f0 = this;
  local_d8 = this_00;
  while( true ) {
    if (local_f8 == iVar7) break;
    iVar8 = (local_f0->super_TextureSpecCase).m_width >> ((byte)iVar7 & 0x1f);
    if (iVar8 < 2) {
      iVar8 = 1;
    }
    iVar9 = (local_f0->super_TextureSpecCase).m_height >> ((byte)iVar7 & 0x1f);
    if (iVar9 < 2) {
      iVar9 = 1;
    }
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_90,0.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&gMax,1.0);
    randomVector<4>((Functional *)&gMin,&rnd,(Vector<float,_4> *)&local_90,(Vector<float,_4> *)&gMax
                   );
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_90,0.0);
    tcu::Vector<float,_4>::Vector(&local_40,1.0);
    randomVector<4>((Functional *)&gMax,&rnd,(Vector<float,_4> *)&local_90,&local_40);
    tcu::TextureLevel::setSize(&data,iVar8,iVar9,1);
    tcu::TextureLevel::getAccess(&local_90,&data);
    tcu::fillWithComponentGradients(&local_90,&gMin,&gMax);
    dVar4 = local_f0->m_format;
    dVar1 = local_f0->m_dataType;
    tcu::TextureLevel::getAccess(&local_90,&data);
    sglr::ContextWrapper::glTexImage2D
              (local_d8,0xde1,iVar7,dVar4,iVar8,iVar9,0,dVar4,dVar1,
               local_90.super_ConstPixelBufferAccess.m_data);
    iVar7 = iVar7 + 1;
  }
  for (iVar7 = 0; local_f8 != iVar7; iVar7 = iVar7 + 1) {
    iVar8 = (local_f0->super_TextureSpecCase).m_width >> ((byte)iVar7 & 0x1f);
    if (iVar8 < 2) {
      iVar8 = 1;
    }
    iVar9 = (local_f0->super_TextureSpecCase).m_height >> ((byte)iVar7 & 0x1f);
    if (iVar9 < 2) {
      iVar9 = 1;
    }
    local_dc = iVar7;
    width = de::Random::getInt((Random *)&rnd.m_rnd,1,iVar8);
    uVar5 = de::Random::getInt((Random *)&rnd.m_rnd,1,iVar9);
    local_e0 = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar8 - width);
    local_d0 = (ulong)uVar5;
    local_e4 = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar9 - uVar5);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_90,0.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&gMax,1.0);
    randomVector<4>((Functional *)&gMin,(Random *)&rnd.m_rnd,(Vector<float,_4> *)&local_90,
                    (Vector<float,_4> *)&gMax);
    pBVar2 = local_f0;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_90,0.0);
    tcu::Vector<float,_4>::Vector(&local_40,1.0);
    randomVector<4>((Functional *)&gMax,(Random *)&rnd.m_rnd,(Vector<float,_4> *)&local_90,&local_40
                   );
    dVar4 = deRandom_getUint32(&rnd.m_rnd);
    tcu::TextureLevel::setSize(&data,width,(int)local_d0,1);
    tcu::TextureLevel::getAccess(&local_90,&data);
    tcu::fillWithGrid(&local_90,dVar4 % 0xf + 2,&gMin,&gMax);
    dVar4 = pBVar2->m_format;
    dVar1 = pBVar2->m_dataType;
    tcu::TextureLevel::getAccess(&local_90,&data);
    iVar7 = local_dc;
    sglr::ContextWrapper::glTexSubImage2D
              (local_d8,0xde1,local_dc,local_e0,local_e4,width,(int)local_d0,dVar4,dVar1,
               local_90.super_ConstPixelBufferAccess.m_data);
  }
  tcu::TextureLevel::~TextureLevel(&data);
  return;
}

Assistant:

void createTexture (void)
	{
		tcu::TextureFormat	fmt			= m_texFormat;
		int					numLevels	= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32			tex			= 0;
		tcu::TextureLevel	data		(fmt);
		de::Random			rnd			(deStringHash(getName()));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		// First specify full texture.
		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			Vec4	gMin		= randomVector<4>(rnd);
			Vec4	gMax		= randomVector<4>(rnd);

			data.setSize(levelW, levelH);
			tcu::fillWithComponentGradients(data.getAccess(), gMin, gMax);

			glTexImage2D(GL_TEXTURE_2D, ndx, m_format, levelW, levelH, 0, m_format, m_dataType, data.getAccess().getDataPtr());
		}

		// Re-specify parts of each level.
		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			int		w			= rnd.getInt(1, levelW);
			int		h			= rnd.getInt(1, levelH);
			int		x			= rnd.getInt(0, levelW-w);
			int		y			= rnd.getInt(0, levelH-h);

			Vec4	colorA		= randomVector<4>(rnd);
			Vec4	colorB		= randomVector<4>(rnd);
			int		cellSize	= rnd.getInt(2, 16);

			data.setSize(w, h);
			tcu::fillWithGrid(data.getAccess(), cellSize, colorA, colorB);

			glTexSubImage2D(GL_TEXTURE_2D, ndx, x, y, w, h, m_format, m_dataType, data.getAccess().getDataPtr());
		}
	}